

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O0

void __thiscall
UKF::PredictMeanAndCovariance(UKF *this,MatrixXd *Xsig_pred,VectorXd *x_out,MatrixXd *P_out)

{
  int iVar1;
  Scalar *pSVar2;
  Nested local_1c0;
  Eigen local_1b8 [16];
  Type local_1a8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>
  local_178;
  ConstColXpr local_160;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_138;
  undefined1 local_100 [8];
  VectorXd x_diff;
  Scalar SStack_e8;
  int i_1;
  ConstColXpr local_e0;
  ScalarMultipleReturnType local_b8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_88;
  int local_44;
  Scalar SStack_40;
  int i;
  MatrixXd *local_28;
  MatrixXd *P_out_local;
  VectorXd *x_out_local;
  MatrixXd *Xsig_pred_local;
  UKF *this_local;
  
  local_28 = P_out;
  P_out_local = (MatrixXd *)x_out;
  x_out_local = (VectorXd *)Xsig_pred;
  Xsig_pred_local = (MatrixXd *)this;
  if ((PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
       ::x == '\0') &&
     (iVar1 = __cxa_guard_acquire(&PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                                   ::x), iVar1 != 0)) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&PredictMeanAndCovariance::x,(long)this->n_x_);
    __cxa_atexit(Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix,&PredictMeanAndCovariance::x,
                 &__dso_handle);
    __cxa_guard_release(&PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                         ::x);
  }
  if ((PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
       ::P == '\0') &&
     (iVar1 = __cxa_guard_acquire(&PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                                   ::P), iVar1 != 0)) {
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&PredictMeanAndCovariance::P,&this->n_x_,&this->n_x_)
    ;
    __cxa_atexit(Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix,&PredictMeanAndCovariance::P,
                 &__dso_handle);
    __cxa_guard_release(&PredictMeanAndCovariance(Eigen::Matrix<double,int,int,int,int,int>const&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                         ::P);
  }
  SStack_40 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::fill
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&PredictMeanAndCovariance::x,
             &stack0xffffffffffffffc0);
  for (local_44 = 0; local_44 < this->n_aug_ * 2 + 1; local_44 = local_44 + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &this->weights_,(long)local_44);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_e0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)x_out_local,
               (long)local_44);
    Eigen::operator*(&local_b8,pSVar2,(StorageBaseType *)&local_e0);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_88,
               (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&PredictMeanAndCovariance::x,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_b8);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)&PredictMeanAndCovariance::x,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                *)&local_88);
  }
  SStack_e8 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::fill
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&PredictMeanAndCovariance::P,
             &stack0xffffffffffffff18);
  for (x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
            = 0;
      x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ <
      this->n_aug_ * 2 + 1;
      x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
           x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
           _4_4_ + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_160,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)x_out_local,
               (long)x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_rows._4_4_);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::operator-
              (&local_138,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>> *)
               &local_160,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&PredictMeanAndCovariance::x);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,_1,1,0,_1,1> *)local_100,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_138);
    while (pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_100,3), 3.141592653589793 < *pSVar2) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_100,3)
      ;
      *pSVar2 = *pSVar2 - 6.283185307179586;
    }
    while (pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_100,3),
          *pSVar2 <= -3.141592653589793 && *pSVar2 != -3.141592653589793) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_100,3)
      ;
      *pSVar2 = *pSVar2 + 6.283185307179586;
    }
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &this->weights_,
                        (long)x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows._4_4_);
    Eigen::operator*(local_1b8,pSVar2,(StorageBaseType *)local_100);
    local_1c0 = (Nested)Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                                  ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_100);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator*(&local_1a8,
                (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)local_1b8,
                (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)&local_1c0
               );
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+
              (&local_178,
               (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&PredictMeanAndCovariance::P,
               (MatrixBase<Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>
                *)&local_1a8);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
              ((Matrix<double,_1,_1,0,_1,_1> *)&PredictMeanAndCovariance::P,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                *)&local_178);
    Eigen::
    GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_2>
    ::~GeneralProduct(&local_1a8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_100);
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)P_out_local,&PredictMeanAndCovariance::x);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(local_28,&PredictMeanAndCovariance::P);
  return;
}

Assistant:

void UKF::PredictMeanAndCovariance(const MatrixXd &Xsig_pred, VectorXd &x_out, MatrixXd &P_out) {
 
  //create vector for predicted state
  static VectorXd x = VectorXd(n_x_);

  //create covariance matrix for prediction
  static MatrixXd P = MatrixXd(n_x_, n_x_);

  //predicted state mean
  x.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points
    x = x + weights_(i) * Xsig_pred.col(i);
  }

  //predicted state covariance matrix
  P.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points

    // state difference
    VectorXd x_diff = Xsig_pred.col(i) - x;
    //angle normalization
    while (x_diff(3)> M_PI) x_diff(3)-=2.*M_PI;
    while (x_diff(3)<-M_PI) x_diff(3)+=2.*M_PI;

    P = P + weights_(i) * x_diff * x_diff.transpose() ;

  }

  //print result
  //std::cout << "Predicted state px,py,v,psi,psi_dot" << std::endl;
  //std::cout << x << std::endl;
  //std::cout << "Predicted covariance matrix P " << std::endl;
  //std::cout << P << std::endl;

  //write result
  x_out = x;
  P_out = P;

  return;
}